

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O2

xer_pbd_rval
INTEGER__xer_body_decode(asn_TYPE_descriptor_t *td,void *sptr,void *chunk_buf,size_t chunk_size)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  void *__ptr;
  undefined8 *puVar5;
  asn_strtol_result_e aVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  xer_pbd_rval xVar12;
  xer_pbd_rval xVar13;
  uint8_t uVar14;
  byte *local_80;
  long dec_value;
  char *dec_value_end;
  INTEGER_t *local_68;
  long local_60;
  asn_TYPE_descriptor_t *local_58;
  byte *local_50;
  byte *local_48;
  void *local_40;
  long local_38;
  
  dec_value_end = (char *)0x0;
  pvVar10 = sptr;
  local_58 = td;
  pvVar9 = malloc((long)((int)(chunk_size / 3) + 2));
  if (pvVar9 == (void *)0x0) {
    return XPBD_SYSTEM_FAILURE;
  }
  pbVar3 = (byte *)(chunk_size + (long)chunk_buf);
  __ptr = *sptr;
  *(undefined4 *)((long)sptr + 8) = 0;
  *(void **)sptr = pvVar9;
  free(__ptr);
  pbVar1 = (byte *)((long)chunk_buf + -1);
  pbVar2 = (byte *)((long)chunk_buf + 1);
  local_60 = chunk_size - 1;
  uVar7 = 0;
  local_80 = (byte *)0x0;
  uVar14 = '\0';
  while( true ) {
    xVar12 = XPBD_BROKEN_ENCODING;
    if (pbVar3 <= chunk_buf) break;
    bVar4 = *chunk_buf;
    xVar13 = XPBD_BROKEN_ENCODING;
    switch(bVar4) {
    case 0x2b:
    case 0x2d:
      if (uVar7 != 0) {
        return XPBD_BROKEN_ENCODING;
      }
      uVar7 = 2;
LAB_0014061f:
      dec_value = 0;
      pvVar10 = (void *)0x0;
      local_80 = (byte *)chunk_buf;
      break;
    case 0x2c:
    case 0x2e:
    case 0x2f:
    case 0x3b:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
      goto switchD_00140517_caseD_2c;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      xVar13 = xVar12;
      switch(uVar7) {
      case 0:
        uVar7 = 3;
        goto LAB_0014061f;
      case 1:
      case 5:
        uVar14 = bVar4 * '\x10';
        uVar7 = 6;
        break;
      case 2:
      case 3:
        uVar7 = 3;
        break;
      default:
        goto switchD_00140517_caseD_2c;
      case 6:
        uVar14 = uVar14 + (bVar4 - 0x30);
LAB_001405f7:
        iVar8 = ((INTEGER_t *)sptr)->size;
        ((INTEGER_t *)sptr)->size = iVar8 + 1;
        ((INTEGER_t *)sptr)->buf[iVar8] = uVar14;
        uVar7 = 8;
      }
      break;
    case 0x3a:
      if (uVar7 == 8) {
        uVar7 = 5;
      }
      else {
        if (uVar7 != 3) {
          return XPBD_BROKEN_ENCODING;
        }
switchD_00140530_caseD_3:
        uVar7 = 1;
        local_80 = (byte *)0x0;
        chunk_buf = pbVar1;
      }
      break;
    case 0x3c:
      if (uVar7 != 0) {
        return XPBD_BROKEN_ENCODING;
      }
      puVar5 = (undefined8 *)local_58->specifics;
      if (puVar5 == (undefined8 *)0x0) {
        return XPBD_BROKEN_ENCODING;
      }
      local_48 = pbVar2;
      lVar11 = local_60;
      if ((long)*(int *)(puVar5 + 2) == 0) {
        return XPBD_BROKEN_ENCODING;
      }
      while ((local_48 < pbVar3 &&
             ((0x3e < (ulong)*local_48 ||
              ((0x4000800100003e00U >> ((ulong)*local_48 & 0x3f) & 1) == 0))))) {
        local_48 = local_48 + 1;
        lVar11 = lVar11 + -1;
      }
      if (lVar11 == 0) {
        return XPBD_BROKEN_ENCODING;
      }
      local_40 = (void *)*puVar5;
      local_38 = puVar5[1];
      local_68 = (INTEGER_t *)sptr;
      local_50 = pbVar2;
      pvVar10 = bsearch(&local_50,local_40,(long)*(int *)(puVar5 + 2),0x18,
                        INTEGER__compar_enum2value);
      if (pvVar10 == (void *)0x0) {
        return XPBD_BROKEN_ENCODING;
      }
      if (local_40 == (void *)0x0) {
        return XPBD_BROKEN_ENCODING;
      }
      pvVar10 = *(void **)((long)local_40 +
                          (ulong)*(uint *)(local_38 + ((long)pvVar10 - (long)local_40) / 6) * 0x18);
      uVar7 = 9;
      chunk_buf = pbVar3 + -1;
      sptr = local_68;
      dec_value = (long)pvVar10;
      break;
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
      xVar13 = xVar12;
      switch(uVar7) {
      case 0:
      case 1:
      case 5:
        uVar14 = bVar4 * '\x10' + 0x90;
        uVar7 = 6;
        break;
      default:
        goto switchD_00140517_caseD_2c;
      case 3:
        goto switchD_00140530_caseD_3;
      case 6:
        uVar14 = uVar14 + (bVar4 < 0x61) * ' ' + bVar4 + 0xa9;
        goto LAB_001405f7;
      }
      break;
    default:
      if (0x20 < bVar4) {
        return XPBD_BROKEN_ENCODING;
      }
      if ((0x100002600U >> ((ulong)(uint)bVar4 & 0x3f) & 1) == 0) {
        return XPBD_BROKEN_ENCODING;
      }
      if (8 < uVar7) {
        return XPBD_BROKEN_ENCODING;
      }
      if ((0x93U >> uVar7 & 1) == 0) {
        if (uVar7 == 3) {
          uVar7 = 4;
          dec_value_end = (char *)chunk_buf;
        }
        else {
          if (uVar7 != 8) {
            return XPBD_BROKEN_ENCODING;
          }
          uVar7 = 7;
        }
      }
    }
    chunk_buf = (void *)((long)chunk_buf + 1);
  }
  xVar13 = xVar12;
  switch(uVar7) {
  case 0:
    xVar13 = XPBD_NOT_BODY_IGNORE;
    break;
  case 1:
  case 2:
  case 5:
  case 6:
    break;
  case 3:
    dec_value_end = (char *)pbVar3;
  case 4:
    aVar6 = asn_strtol_lim((char *)local_80,&dec_value_end,&dec_value);
    uVar7 = aVar6 + 3;
    pvVar10 = (void *)dec_value;
    if ((uVar7 < 5) && ((0x17U >> (uVar7 & 0x1f) & 1) != 0)) {
      xVar13 = (&DAT_00162f50)[uVar7];
    }
    else {
switchD_00140767_default:
      iVar8 = asn_long2INTEGER((INTEGER_t *)sptr,(long)pvVar10);
      xVar13 = (uint)(iVar8 == 0) << 2;
    }
    break;
  case 7:
    ((INTEGER_t *)sptr)->buf[((INTEGER_t *)sptr)->size] = '\0';
    xVar13 = XPBD_BODY_CONSUMED;
    break;
  default:
    goto switchD_00140767_default;
  }
switchD_00140517_caseD_2c:
  return xVar13;
}

Assistant:

static enum xer_pbd_rval
INTEGER__xer_body_decode(asn_TYPE_descriptor_t *td, void *sptr, const void *chunk_buf, size_t chunk_size) {
	INTEGER_t *st = (INTEGER_t *)sptr;
	long dec_value;
	long hex_value = 0;
	const char *lp;
	const char *lstart = (const char *)chunk_buf;
	const char *lstop = lstart + chunk_size;
	enum {
		ST_LEADSPACE,
		ST_SKIPSPHEX,
		ST_WAITDIGITS,
		ST_DIGITS,
		ST_DIGITS_TRAILSPACE,
		ST_HEXDIGIT1,
		ST_HEXDIGIT2,
		ST_HEXDIGITS_TRAILSPACE,
		ST_HEXCOLON,
		ST_END_ENUM,
		ST_UNEXPECTED
	} state = ST_LEADSPACE;
	const char *dec_value_start = 0; /* INVARIANT: always !0 in ST_DIGITS */
	const char *dec_value_end = 0;

	if(chunk_size)
		ASN_DEBUG("INTEGER body %ld 0x%2x..0x%2x",
			(long)chunk_size, *lstart, lstop[-1]);

	if(INTEGER_st_prealloc(st, (chunk_size/3) + 1))
		return XPBD_SYSTEM_FAILURE;

	/*
	 * We may have received a tag here. It will be processed inline.
	 * Use strtoul()-like code and serialize the result.
	 */
	for(lp = lstart; lp < lstop; lp++) {
		int lv = *lp;
		switch(lv) {
		case 0x09: case 0x0a: case 0x0d: case 0x20:
			switch(state) {
			case ST_LEADSPACE:
			case ST_DIGITS_TRAILSPACE:
			case ST_HEXDIGITS_TRAILSPACE:
			case ST_SKIPSPHEX:
				continue;
			case ST_DIGITS:
				dec_value_end = lp;
				state = ST_DIGITS_TRAILSPACE;
				continue;
			case ST_HEXCOLON:
				state = ST_HEXDIGITS_TRAILSPACE;
				continue;
			default:
				break;
			}
			break;
		case 0x2d:	/* '-' */
			if(state == ST_LEADSPACE) {
				dec_value = 0;
				dec_value_start = lp;
				state = ST_WAITDIGITS;
				continue;
			}
			break;
		case 0x2b:	/* '+' */
			if(state == ST_LEADSPACE) {
				dec_value = 0;
				dec_value_start = lp;
				state = ST_WAITDIGITS;
				continue;
			}
			break;
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34:
		case 0x35: case 0x36: case 0x37: case 0x38: case 0x39:
			switch(state) {
			case ST_DIGITS: continue;
			case ST_SKIPSPHEX:	/* Fall through */
			case ST_HEXDIGIT1:
				hex_value = (lv - 0x30) << 4;
				state = ST_HEXDIGIT2;
				continue;
			case ST_HEXDIGIT2:
				hex_value += (lv - 0x30);
				state = ST_HEXCOLON;
				st->buf[st->size++] = (uint8_t)hex_value;
				continue;
			case ST_HEXCOLON:
				return XPBD_BROKEN_ENCODING;
			case ST_LEADSPACE:
				dec_value = 0;
				dec_value_start = lp;
				/* FALL THROUGH */
			case ST_WAITDIGITS:
				state = ST_DIGITS;
				continue;
			default:
				break;
			}
			break;
		case 0x3c:	/* '<', start of XML encoded enumeration */
			if(state == ST_LEADSPACE) {
				const asn_INTEGER_enum_map_t *el;
				el = INTEGER_map_enum2value(
					(asn_INTEGER_specifics_t *)
					td->specifics, lstart, lstop);
				if(el) {
					ASN_DEBUG("Found \"%s\" => %ld",
						el->enum_name, el->nat_value);
					dec_value = el->nat_value;
					state = ST_END_ENUM;
					lp = lstop - 1;
					continue;
				}
				ASN_DEBUG("Unknown identifier for INTEGER");
			}
			return XPBD_BROKEN_ENCODING;
		case 0x3a:	/* ':' */
			if(state == ST_HEXCOLON) {
				/* This colon is expected */
				state = ST_HEXDIGIT1;
				continue;
			} else if(state == ST_DIGITS) {
				/* The colon here means that we have
				 * decoded the first two hexadecimal
				 * places as a decimal value.
				 * Switch decoding mode. */
				ASN_DEBUG("INTEGER re-evaluate as hex form");
				state = ST_SKIPSPHEX;
				dec_value_start = 0;
				lp = lstart - 1;
				continue;
			} else {
				ASN_DEBUG("state %d at %ld", state, (long)(lp - lstart));
				break;
			}
		/* [A-Fa-f] */
		case 0x41:case 0x42:case 0x43:case 0x44:case 0x45:case 0x46:
		case 0x61:case 0x62:case 0x63:case 0x64:case 0x65:case 0x66:
			switch(state) {
			case ST_SKIPSPHEX:
			case ST_LEADSPACE: /* Fall through */
			case ST_HEXDIGIT1:
				hex_value = lv - ((lv < 0x61) ? 0x41 : 0x61);
				hex_value += 10;
				hex_value <<= 4;
				state = ST_HEXDIGIT2;
				continue;
			case ST_HEXDIGIT2:
				hex_value += lv - ((lv < 0x61) ? 0x41 : 0x61);
				hex_value += 10;
				st->buf[st->size++] = (uint8_t)hex_value;
				state = ST_HEXCOLON;
				continue;
			case ST_DIGITS:
				ASN_DEBUG("INTEGER re-evaluate as hex form");
				state = ST_SKIPSPHEX;
				dec_value_start = 0;
				lp = lstart - 1;
				continue;
			default:
				break;
			}
			break;
		}

		/* Found extra non-numeric stuff */
		ASN_DEBUG("INTEGER :: Found non-numeric 0x%2x at %ld",
			lv, (long)(lp - lstart));
		state = ST_UNEXPECTED;
		break;
	}

	switch(state) {
	case ST_END_ENUM:
		/* Got a complete and valid enumeration encoded as a tag. */
		break;
	case ST_DIGITS:
		dec_value_end = lstop;
		/* FALL THROUGH */
	case ST_DIGITS_TRAILSPACE:
		/* The last symbol encountered was a digit. */
		switch(asn_strtol_lim(dec_value_start, &dec_value_end, &dec_value)) {
		case ASN_STRTOL_OK:
			break;
		case ASN_STRTOL_ERROR_RANGE:
			return XPBD_DECODER_LIMIT;
		case ASN_STRTOL_ERROR_INVAL:
		case ASN_STRTOL_EXPECT_MORE:
		case ASN_STRTOL_EXTRA_DATA:
			return XPBD_BROKEN_ENCODING;
		}
		break;
	case ST_HEXCOLON:
	case ST_HEXDIGITS_TRAILSPACE:
		st->buf[st->size] = 0;	/* Just in case termination */
		return XPBD_BODY_CONSUMED;
	case ST_HEXDIGIT1:
	case ST_HEXDIGIT2:
	case ST_SKIPSPHEX:
		return XPBD_BROKEN_ENCODING;
	case ST_LEADSPACE:
		/* Content not found */
		return XPBD_NOT_BODY_IGNORE;
	case ST_WAITDIGITS:
	case ST_UNEXPECTED:
		ASN_DEBUG("INTEGER: No useful digits (state %d)", state);
		return XPBD_BROKEN_ENCODING;	/* No digits */
	}

	/*
	 * Convert the result of parsing of enumeration or a straight
	 * decimal value into a BER representation.
	 */
	if(asn_long2INTEGER(st, dec_value))
		return XPBD_SYSTEM_FAILURE;

	return XPBD_BODY_CONSUMED;
}